

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Exception::Exception(Exception *this,String *msg)

{
  *(undefined ***)this = &PTR__Exception_00149bc0;
  std::__cxx11::string::string((string *)&this->msg_,(string *)msg);
  return;
}

Assistant:

Exception::Exception(String msg) : msg_(std::move(msg)) {}